

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O2

int CVodeSetJacEvalFrequency(void *cvode_mem,long msbj)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetJacEvalFrequency",&cv_mem,&cvls_mem);
  if (iVar1 == 0) {
    if (msbj < 0) {
      iVar1 = -3;
      cvProcessError(cv_mem,-3,"CVLS","CVodeSetJacEvalFrequency",
                     "A negative evaluation frequency was provided.");
    }
    else {
      if (msbj == 0) {
        msbj = 0x33;
      }
      cvls_mem->msbj = msbj;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int CVodeSetJacEvalFrequency(void *cvode_mem, long int msbj)
{
  CVodeMem cv_mem;
  CVLsMem  cvls_mem;
  int      retval;

  /* access CVLsMem structure; store input and return */
  retval = cvLs_AccessLMem(cvode_mem, "CVodeSetJacEvalFrequency",
                           &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS)  return(retval);

  /* Check for legal msbj */
  if(msbj < 0) {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, "CVLS", "CVodeSetJacEvalFrequency",
                   "A negative evaluation frequency was provided.");
    return(CVLS_ILL_INPUT);
  }

  cvls_mem->msbj = (msbj == 0) ? CVLS_MSBJ : msbj;

  return(CVLS_SUCCESS);
}